

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O3

void tchecker::
     make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
     ::destruct(make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *ptr)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            (&(ptr->
              super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
              ).
              super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              .
              super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              ._node);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            (&(ptr->
              super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
              ).
              super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              .
              super_edge_node_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              ._node);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            (&(ptr->
              super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
              ).
              super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              .
              super_next_edge_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              ._next);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              *)&(ptr->
                 super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                 ).
                 super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
            );
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
              *)ptr);
  return;
}

Assistant:

static void destruct(make_shared_t<T, REFCOUNT, RESERVED> * ptr) { ptr->~make_shared_t<T, REFCOUNT, RESERVED>(); }